

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O1

void __thiscall glslang::TSymbolTable::adoptLevels(TSymbolTable *this,TSymbolTable *symTable)

{
  pointer *pppTVar1;
  iterator __position;
  bool bVar2;
  pointer ppTVar3;
  ulong uVar4;
  ulong uVar5;
  
  ppTVar3 = (symTable->table).
            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((symTable->table).
      super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      __position._M_current =
           (this->table).
           super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->table).
          super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<glslang::TSymbolTableLevel*,std::allocator<glslang::TSymbolTableLevel*>>::
        _M_realloc_insert<glslang::TSymbolTableLevel*const&>
                  ((vector<glslang::TSymbolTableLevel*,std::allocator<glslang::TSymbolTableLevel*>>
                    *)this,__position,ppTVar3 + uVar4);
      }
      else {
        *__position._M_current = ppTVar3[uVar4];
        pppTVar1 = &(this->table).
                    super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      this->adoptedLevels = this->adoptedLevels + 1;
      ppTVar3 = (symTable->table).
                super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar5 < (ulong)((long)(symTable->table).
                                    super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3)
      ;
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  this->uniqueId = symTable->uniqueId;
  this->noBuiltInRedeclarations = symTable->noBuiltInRedeclarations;
  this->separateNameSpaces = symTable->separateNameSpaces;
  return;
}

Assistant:

void adoptLevels(TSymbolTable& symTable)
    {
        for (unsigned int level = 0; level < symTable.table.size(); ++level) {
            table.push_back(symTable.table[level]);
            ++adoptedLevels;
        }
        uniqueId = symTable.uniqueId;
        noBuiltInRedeclarations = symTable.noBuiltInRedeclarations;
        separateNameSpaces = symTable.separateNameSpaces;
    }